

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ComparisonTestT<char>(void)

{
  ComparisonTestTU<char,char>();
  ComparisonTestTU<char,signed_char>();
  ComparisonTestTU<char,unsigned_char>();
  ComparisonTestTU<char,short>();
  ComparisonTestTU<char,unsigned_short>();
  ComparisonTestTU<char,int>();
  ComparisonTestTU<char,unsigned_int>();
  ComparisonTestTU<char,long>();
  ComparisonTestTU<char,unsigned_long>();
  ComparisonTestTU<char,long_long>();
  ComparisonTestTU<char,unsigned_long_long>();
  return;
}

Assistant:

void ComparisonTestT()
	{
		ComparisonTestTU<T, char>();
		ComparisonTestTU<T, signed char>();
		ComparisonTestTU<T, unsigned char>();
		ComparisonTestTU<T, signed short>();
		ComparisonTestTU<T, unsigned short>();
		ComparisonTestTU<T, signed int>();
		ComparisonTestTU<T, unsigned int>();
		ComparisonTestTU<T, signed long>();
		ComparisonTestTU<T, unsigned long>();
		ComparisonTestTU<T, signed long long>();
		ComparisonTestTU<T, unsigned long long>();
	}